

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDimple::IsValidLevel
          (ON_SubDimple *this,ON_SubD *subd,uint level_index,bool bSilentError,ON_TextLog *text_log)

{
  ON_SubDLevel *this_00;
  ON_SubDLevel *pOVar1;
  unsigned_short level_00;
  uint uVar2;
  uint uVar3;
  ON_SubDLevel **ppOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDEdge *pOVar6;
  ON_SubDFace *pOVar7;
  ON__UINT_PTR end_index;
  bool bVar8;
  bool local_1ea;
  undefined1 local_188 [8];
  ON_3dPoint P [2];
  ON_SubDFace *last_face;
  ON_SubDFaceIterator fit;
  ON_SubDEdge *last_edge;
  ON_SubDEdgeIterator eit;
  ON_SubDVertex *last_vertex;
  undefined1 local_c0 [8];
  ON_SubDVertexIterator vit;
  uint wire_edge_count;
  uint point_vertex_count;
  uint f_id_range [2];
  uint e_id_range [2];
  uint v_id_range [2];
  ON_SubDFace *face;
  ON_SubDEdge *edge;
  ON_SubDVertex *vertex;
  uint i;
  unsigned_short expected_level;
  ON_SubDLevel *previous_level;
  ON_SubDLevel *level;
  uint level_count;
  ON_TextLog *text_log_local;
  bool bSilentError_local;
  uint level_index_local;
  ON_SubD *subd_local;
  ON_SubDimple *this_local;
  
  uVar2 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels);
  if ((level_index < uVar2) && (level_index < 0xffff)) {
    ppOVar4 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&this->m_levels,level_index);
    this_00 = *ppOVar4;
    if (this_00 == (ON_SubDLevel *)0x0) {
      this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
    }
    else {
      ON_SubDLevel::ClearComponentDamagedState(this_00);
      if (this_00->m_level_index == level_index) {
        if (level_index == 0) {
          if (this_00->m_vertex_count < 3) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
          if (this_00->m_edge_count < 3) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
          if (this_00->m_face_count == 0) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
        }
        else {
          ppOVar4 = ON_SimpleArray<ON_SubDLevel_*>::operator[](&this->m_levels,level_index - 1);
          pOVar1 = *ppOVar4;
          if (pOVar1 == (ON_SubDLevel *)0x0) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
          if (this_00->m_vertex_count <= pOVar1->m_vertex_count) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
          if (this_00->m_edge_count <= pOVar1->m_edge_count) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
          if (this_00->m_face_count <= pOVar1->m_face_count) {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            goto LAB_00879008;
          }
        }
        if (this_00->m_vertex[0] == (ON_SubDVertex *)0x0) {
          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
        else if (this_00->m_edge[0] == (ON_SubDEdge *)0x0) {
          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
        else if (this_00->m_face[0] == (ON_SubDFace *)0x0) {
          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
        else if (this_00->m_vertex[1] == (ON_SubDVertex *)0x0) {
          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
        else if (this_00->m_edge[1] == (ON_SubDEdge *)0x0) {
          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
        else if (this_00->m_face[1] == (ON_SubDFace *)0x0) {
          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
        else {
          level_00 = (unsigned_short)level_index;
          e_id_range[0] = 0xffffffff;
          e_id_range[1] = 0xffffffff;
          f_id_range[0] = 0xffffffff;
          f_id_range[1] = 0xffffffff;
          _wire_edge_count = 0xffffffffffffffff;
          vit.m_component_ptr.m_ptr._4_4_ = 0;
          vit.m_component_ptr.m_ptr._0_4_ = 0;
          uVar2 = ON_SubD::ActiveLevelIndex(subd);
          if (level_index == uVar2) {
            pOVar5 = ON_SubD::FirstVertex(subd);
            if (pOVar5 != this_00->m_vertex[0]) {
              this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
              goto LAB_00879008;
            }
            ON_SubD::VertexIterator((ON_SubDVertexIterator *)local_c0,subd);
            pOVar5 = ON_SubDVertexIterator::FirstVertex((ON_SubDVertexIterator *)local_c0);
            bVar8 = pOVar5 != this_00->m_vertex[0];
            if (bVar8) {
              this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            }
            ON_SubDVertexIterator::~ON_SubDVertexIterator((ON_SubDVertexIterator *)local_c0);
            if (bVar8) goto LAB_00879008;
          }
          eit.m_component_ptr.m_ptr = 0;
          vertex._0_4_ = 0;
          edge = (ON_SubDEdge *)this_00->m_vertex[0];
          for (; (uint)vertex < this_00->m_vertex_count && edge != (ON_SubDEdge *)0x0;
              vertex._0_4_ = (uint)vertex + 1) {
            bVar8 = IsValidSubDVertex((ON_SubDVertex *)edge,level_00,(uint *)0x0,4,bSilentError);
            if (!bVar8) {
              this_local._7_1_ = 0;
              goto LAB_00879008;
            }
            if ((uint)vertex == 0) {
              e_id_range[1] = (edge->super_ON_SubDComponentBase).m_id;
              e_id_range[0] = e_id_range[1];
            }
            else if ((edge->super_ON_SubDComponentBase).m_id < e_id_range[0]) {
              e_id_range[0] = (edge->super_ON_SubDComponentBase).m_id;
            }
            else if (e_id_range[1] < (edge->super_ON_SubDComponentBase).m_id) {
              e_id_range[1] = (edge->super_ON_SubDComponentBase).m_id;
            }
            if ((short)edge->m_face2[0].m_ptr == 0) {
              vit.m_component_ptr.m_ptr._4_4_ = vit.m_component_ptr.m_ptr._4_4_ + 1;
            }
            eit.m_component_ptr.m_ptr = (ON__UINT_PTR)edge;
            edge = edge->m_next_edge;
          }
          if (this_00->m_vertex[1] == (ON_SubDVertex *)eit.m_component_ptr.m_ptr) {
            if (((uint)vertex == this_00->m_vertex_count) && (edge == (ON_SubDEdge *)0x0)) {
              uVar2 = e_id_range[1];
              if ((e_id_range[1] + 1) - e_id_range[0] < this_00->m_vertex_count) {
                this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
              }
              else {
                uVar3 = MaximumVertexId(this);
                if (uVar3 < uVar2) {
                  this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                }
                else if (vit.m_component_ptr.m_ptr._4_4_ == 0) {
                  uVar2 = ON_SubD::ActiveLevelIndex(subd);
                  if (level_index == uVar2) {
                    pOVar6 = ON_SubD::FirstEdge(subd);
                    if (pOVar6 != this_00->m_edge[0]) {
                      this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                      goto LAB_00879008;
                    }
                    ON_SubD::EdgeIterator((ON_SubDEdgeIterator *)&last_edge,subd);
                    pOVar6 = ON_SubDEdgeIterator::FirstEdge((ON_SubDEdgeIterator *)&last_edge);
                    bVar8 = pOVar6 != this_00->m_edge[0];
                    if (bVar8) {
                      this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                    }
                    ON_SubDEdgeIterator::~ON_SubDEdgeIterator((ON_SubDEdgeIterator *)&last_edge);
                    if (bVar8) goto LAB_00879008;
                  }
                  fit.m_component_ptr.m_ptr = 0;
                  vertex._0_4_ = 0;
                  face = (ON_SubDFace *)this_00->m_edge[0];
                  for (; (uint)vertex < this_00->m_edge_count && face != (ON_SubDFace *)0x0;
                      vertex._0_4_ = (uint)vertex + 1) {
                    bVar8 = IsValidSubDEdge((ON_SubDEdge *)face,level_00,(uint *)0x0,bSilentError);
                    if (!bVar8) {
                      this_local._7_1_ = 0;
                      goto LAB_00879008;
                    }
                    if ((short)face->m_pack_id == 0) {
                      vit.m_component_ptr.m_ptr._0_4_ = (int)vit.m_component_ptr.m_ptr + 1;
                    }
                    if ((uint)vertex == 0) {
                      f_id_range[1] = (face->super_ON_SubDComponentBase).m_id;
                      f_id_range[0] = f_id_range[1];
                    }
                    else if ((face->super_ON_SubDComponentBase).m_id < f_id_range[0]) {
                      f_id_range[0] = (face->super_ON_SubDComponentBase).m_id;
                    }
                    else if (f_id_range[1] < (face->super_ON_SubDComponentBase).m_id) {
                      f_id_range[1] = (face->super_ON_SubDComponentBase).m_id;
                    }
                    fit.m_component_ptr.m_ptr = (ON__UINT_PTR)face;
                    face = face->m_next_face;
                  }
                  if (((uint)vertex == this_00->m_edge_count) && (face == (ON_SubDFace *)0x0)) {
                    uVar2 = f_id_range[1];
                    if ((f_id_range[1] + 1) - f_id_range[0] < this_00->m_edge_count) {
                      this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                    }
                    else if (this_00->m_edge[1] == (ON_SubDEdge *)fit.m_component_ptr.m_ptr) {
                      uVar3 = MaximumEdgeId(this);
                      if (uVar3 < uVar2) {
                        this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                      }
                      else {
                        uVar2 = ON_SubD::ActiveLevelIndex(subd);
                        if (level_index == uVar2) {
                          pOVar7 = ON_SubD::FirstFace(subd);
                          if (pOVar7 != this_00->m_face[0]) {
                            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                            goto LAB_00879008;
                          }
                          ON_SubD::FaceIterator((ON_SubDFaceIterator *)&last_face,subd);
                          pOVar7 = ON_SubDFaceIterator::FirstFace((ON_SubDFaceIterator *)&last_face)
                          ;
                          bVar8 = pOVar7 != this_00->m_face[0];
                          if (bVar8) {
                            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                          }
                          ON_SubDFaceIterator::~ON_SubDFaceIterator
                                    ((ON_SubDFaceIterator *)&last_face);
                          if (bVar8) goto LAB_00879008;
                        }
                        P[1].z = 0.0;
                        vertex._0_4_ = 0;
                        v_id_range = (uint  [2])this_00->m_face[0];
                        for (; local_1ea = (uint)vertex < this_00->m_face_count &&
                                           v_id_range != (uint  [2])0x0, local_1ea;
                            vertex._0_4_ = (uint)vertex + 1) {
                          bVar8 = IsValidSubDFace((ON_SubDFace *)v_id_range,level_00,(uint *)0x0,4,
                                                  bSilentError);
                          if (!bVar8) {
                            this_local._7_1_ = 0;
                            goto LAB_00879008;
                          }
                          if ((uint)vertex == 0) {
                            _wire_edge_count =
                                 CONCAT44(*(undefined4 *)((long)v_id_range + 8),
                                          *(undefined4 *)((long)v_id_range + 8));
                          }
                          else if (*(uint *)((long)v_id_range + 8) < wire_edge_count) {
                            _wire_edge_count =
                                 CONCAT44(point_vertex_count,*(undefined4 *)((long)v_id_range + 8));
                          }
                          else if (point_vertex_count < *(uint *)((long)v_id_range + 8)) {
                            _wire_edge_count =
                                 CONCAT44(*(undefined4 *)((long)v_id_range + 8),wire_edge_count);
                          }
                          P[1].z._0_4_ = v_id_range[0];
                          P[1].z._4_4_ = v_id_range[1];
                          v_id_range = *(uint (*) [2])((long)v_id_range + 0x58);
                        }
                        if (((uint)vertex == this_00->m_face_count) &&
                           (v_id_range == (uint  [2])0x0)) {
                          uVar2 = point_vertex_count;
                          if ((point_vertex_count + 1) - wire_edge_count < this_00->m_face_count) {
                            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                          }
                          else if (this_00->m_face[1] == (ON_SubDFace *)P[1].z) {
                            uVar3 = MaximumFaceId(this);
                            if (uVar3 < uVar2) {
                              this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                            }
                            else {
                              for (edge = (ON_SubDEdge *)this_00->m_vertex[0];
                                  edge != (ON_SubDEdge *)0x0; edge = edge->m_next_edge) {
                                for (vertex._0_4_ = 0; (uint)vertex < (ushort)edge->m_face2[0].m_ptr
                                    ; vertex._0_4_ = (uint)vertex + 1) {
                                  pOVar6 = ON_SubDVertex::Edge((ON_SubDVertex *)edge,(uint)vertex);
                                  bVar8 = IsValidSubDEdge(pOVar6,level_00,f_id_range,bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                  end_index = ON_SubDVertex::EdgeDirection
                                                        ((ON_SubDVertex *)edge,(uint)vertex);
                                  bVar8 = IsValidVertexEdgeLink
                                                    ((ON_SubDVertex *)edge,pOVar6,end_index,
                                                     bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                }
                                for (vertex._0_4_ = 0;
                                    (uint)vertex < *(ushort *)((long)&edge->m_face2[0].m_ptr + 2);
                                    vertex._0_4_ = (uint)vertex + 1) {
                                  pOVar7 = ON_SubDVertex::Face((ON_SubDVertex *)edge,(uint)vertex);
                                  bVar8 = IsValidSubDFace(pOVar7,level_00,&wire_edge_count,4,
                                                          bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                  bVar8 = IsValidVertexFaceLink
                                                    ((ON_SubDVertex *)edge,pOVar7,(uint)vertex,
                                                     0xffffffff,bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                }
                              }
                              for (face = (ON_SubDFace *)this_00->m_edge[0];
                                  face != (ON_SubDFace *)0x0; face = face->m_next_face) {
                                for (vertex._0_4_ = 0; (uint)vertex < 2;
                                    vertex._0_4_ = (uint)vertex + 1) {
                                  pOVar5 = (ON_SubDVertex *)
                                           face->m_pack_rect_size[(ulong)(uint)vertex + 1];
                                  bVar8 = IsValidSubDVertex(pOVar5,level_00,e_id_range,4,
                                                            bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                  bVar8 = IsValidVertexEdgeLink
                                                    (pOVar5,(ON_SubDEdge *)face,(ulong)(uint)vertex,
                                                     bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                }
                                for (vertex._0_4_ = 0; (uint)vertex < (ushort)face->m_pack_id;
                                    vertex._0_4_ = (uint)vertex + 1) {
                                  pOVar7 = ON_SubDEdge::Face((ON_SubDEdge *)face,(uint)vertex);
                                  bVar8 = IsValidSubDFace(pOVar7,level_00,&wire_edge_count,4,
                                                          bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                  bVar8 = IsValidEdgeFaceLink((ON_SubDEdge *)face,pOVar7,
                                                              (uint)vertex,0xffffffff,bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                }
                              }
                              for (v_id_range = (uint  [2])this_00->m_face[0];
                                  v_id_range != (uint  [2])0x0;
                                  v_id_range = *(uint (*) [2])((long)v_id_range + 0x58)) {
                                for (vertex._0_4_ = 0;
                                    (uint)vertex < *(ushort *)((long)v_id_range + 0x9c);
                                    vertex._0_4_ = (uint)vertex + 1) {
                                  pOVar6 = ON_SubDFace::Edge((ON_SubDFace *)v_id_range,(uint)vertex)
                                  ;
                                  bVar8 = IsValidSubDEdge(pOVar6,level_00,f_id_range,bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                  bVar8 = IsValidEdgeFaceLink(pOVar6,(ON_SubDFace *)v_id_range,
                                                              0xffffffff,(uint)vertex,bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                }
                                for (vertex._0_4_ = 0;
                                    (uint)vertex < *(ushort *)((long)v_id_range + 0x9c);
                                    vertex._0_4_ = (uint)vertex + 1) {
                                  pOVar5 = ON_SubDFace::Vertex((ON_SubDFace *)v_id_range,
                                                               (uint)vertex);
                                  bVar8 = IsValidSubDVertex(pOVar5,level_00,e_id_range,4,
                                                            bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                  bVar8 = IsValidVertexFaceLink
                                                    (pOVar5,(ON_SubDFace *)v_id_range,0xffffffff,
                                                     (uint)vertex,bSilentError);
                                  if (!bVar8) {
                                    this_local._7_1_ = 0;
                                    goto LAB_00879008;
                                  }
                                }
                              }
                              for (face = (ON_SubDFace *)this_00->m_edge[0];
                                  face != (ON_SubDFace *)0x0; face = face->m_next_face) {
                                bVar8 = IsValidSubDEdgeTag((ON_SubDEdge *)face,bSilentError);
                                if (!bVar8) {
                                  this_local._7_1_ = 0;
                                  goto LAB_00879008;
                                }
                              }
                              for (edge = (ON_SubDEdge *)this_00->m_vertex[0];
                                  edge != (ON_SubDEdge *)0x0; edge = edge->m_next_edge) {
                                bVar8 = IsValidSubDVertexTag((ON_SubDVertex *)edge,bSilentError);
                                if (!bVar8) {
                                  this_local._7_1_ = 0;
                                  goto LAB_00879008;
                                }
                              }
                              for (face = (ON_SubDFace *)this_00->m_edge[0];
                                  face != (ON_SubDFace *)0x0; face = face->m_next_face) {
                                ON_SubDVertex::ControlNetPoint
                                          ((ON_3dPoint *)local_188,
                                           (ON_SubDVertex *)face->m_pack_rect_size[1]);
                                ON_SubDVertex::ControlNetPoint
                                          ((ON_3dPoint *)&P[0].z,
                                           *(ON_SubDVertex **)&face->m_reserved2);
                                bVar8 = ON_3dPoint::operator!=
                                                  ((ON_3dPoint *)local_188,(ON_3dPoint *)&P[0].z);
                                if (!bVar8) {
                                  ON_ComponentStatus::SetDamagedState
                                            (&(face->super_ON_SubDComponentBase).m_status,true);
                                  this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                                  goto LAB_00879008;
                                }
                              }
                              this_local._7_1_ = 1;
                            }
                          }
                          else {
                            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                          }
                        }
                        else {
                          this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                        }
                      }
                    }
                    else {
                      this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                    }
                  }
                  else {
                    this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                  }
                }
                else {
                  this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
                }
              }
            }
            else {
              this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            }
          }
          else {
            this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
          }
        }
      }
      else {
        this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
      }
    }
  }
  else {
    this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
LAB_00879008:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_SubDimple::IsValidLevel(
  const ON_SubD& subd,
  unsigned int level_index,
  bool bSilentError,
  ON_TextLog* text_log
  ) const
{
  const unsigned int level_count = m_levels.UnsignedCount();
  if (level_index >= level_count || level_index >= 0xFFFF)
    return ON_SubDIsNotValid(bSilentError);
  const ON_SubDLevel* level = m_levels[level_index];
  if ( nullptr == level)
    return ON_SubDIsNotValid(bSilentError);
  level->ClearComponentDamagedState();

  if ( level->m_level_index != level_index)
    return ON_SubDIsNotValid(bSilentError);

  if (level_index <= 0)
  {
    if (level->m_vertex_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count < 3)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count < 1)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    const ON_SubDLevel* previous_level = m_levels[level_index - 1];
    if (nullptr == previous_level)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_vertex_count <= previous_level->m_vertex_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_edge_count <= previous_level->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (level->m_face_count <= previous_level->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
  }

  if (nullptr == level->m_vertex[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[0])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[0])
    return ON_SubDIsNotValid(bSilentError);

  if (nullptr == level->m_vertex[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_edge[1])
    return ON_SubDIsNotValid(bSilentError);
  if (nullptr == level->m_face[1])
    return ON_SubDIsNotValid(bSilentError);


  const unsigned short expected_level = (unsigned short)level_index;
  unsigned int i;
  const ON_SubDVertex* vertex;
  const ON_SubDEdge* edge;
  const ON_SubDFace* face;

  unsigned int v_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int e_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };
  unsigned int f_id_range[2] = { ON_UNSET_UINT_INDEX, ON_UNSET_UINT_INDEX };

  unsigned int point_vertex_count = 0;
  unsigned int wire_edge_count = 0;

  // simple vertex validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDVertexIterator vit = subd.VertexIterator();
    if (vit.FirstVertex() != level->m_vertex[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDVertexArray va = subd.VertexArray();
    //if (va.VertexCount() != level->m_vertex_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[0] != level->m_vertex[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (va[level->m_vertex_count-1] != level->m_vertex[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDVertex* last_vertex = nullptr;
  for (i = 0, vertex = level->m_vertex[0]; i < level->m_vertex_count && nullptr != vertex; i++, vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertex(vertex, expected_level, nullptr, level->m_ordinary_vertex_valence, bSilentError))
      return false;

    if (0 == i)
    {
      v_id_range[0] = v_id_range[1] = vertex->m_id;
    }
    else if (vertex->m_id < v_id_range[0])
      v_id_range[0] = vertex->m_id;
    else if (vertex->m_id > v_id_range[1])
      v_id_range[1] = vertex->m_id;

    if (0 == vertex->m_edge_count)
    {
      point_vertex_count++;
    }
    last_vertex = vertex;
  }
  if (level->m_vertex[1] != last_vertex)
    return ON_SubDIsNotValid(bSilentError);


  if (i != level->m_vertex_count || nullptr != vertex)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + v_id_range[1] - v_id_range[0] < level->m_vertex_count)
    return ON_SubDIsNotValid(bSilentError);
  if ( v_id_range[1] > MaximumVertexId() )
    return ON_SubDIsNotValid(bSilentError);

  // currently, point vertices are not permitted
  if (point_vertex_count > 0)
    return ON_SubDIsNotValid(bSilentError);

  // simple edge validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDEdgeIterator eit = subd.EdgeIterator();
    if (eit.FirstEdge() != level->m_edge[0])
      return ON_SubDIsNotValid(bSilentError);

    // IsValid() should not create these clunky cached arrays.
    //ON_SubDEdgeArray ea = subd.EdgeArray();
    //if (ea.EdgeCount() != level->m_edge_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[0] != level->m_edge[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (ea[level->m_edge_count-1] != level->m_edge[1])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDEdge* last_edge = nullptr;
  for (i = 0, edge = level->m_edge[0]; i < level->m_edge_count && nullptr != edge; i++, edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdge(edge, expected_level, nullptr, bSilentError))
      return false;
    if (0 == edge->m_face_count)
    {
      wire_edge_count++;
    }
    if (0 == i)
    {
      e_id_range[0] = e_id_range[1] = edge->m_id;
    }
    else if (edge->m_id < e_id_range[0])
      e_id_range[0] = edge->m_id;
    else if (edge->m_id > e_id_range[1])
      e_id_range[1] = edge->m_id;

    last_edge = edge;
  }
  if (i != level->m_edge_count || nullptr != edge)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + e_id_range[1] - e_id_range[0] < level->m_edge_count)
    return ON_SubDIsNotValid(bSilentError);
  if (level->m_edge[1] != last_edge)
    return ON_SubDIsNotValid(bSilentError);
  if ( e_id_range[1] > MaximumEdgeId() )
    return ON_SubDIsNotValid(bSilentError);
   
  // As of November 12, 2019
  // Wire edges are permitted. THey exist in subds being edited.
  ////// currently, wire edges are not permitted
  ////if (wire_edge_count > 0)
  ////  return ON_SubDIsNotValid(bSilentError);
   
  // simple face validation
  if (level_index == subd.ActiveLevelIndex())
  {
    if (subd.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    ON_SubDFaceIterator fit = subd.FaceIterator();
    if (fit.FirstFace() != level->m_face[0])
      return ON_SubDIsNotValid(bSilentError);
    // IsValid() should not create these clunky cached arrays.
    //ON_SubDFaceArray fa = subd.FaceArray();
    //if (fa.FaceCount() != level->m_face_count)
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
    //if (fa[0] != level->m_face[0])
    //  return ON_SubDIsNotValid(bSilentError);
  }
  const ON_SubDFace* last_face = nullptr;
  for (i = 0, face = level->m_face[0]; i < level->m_face_count && nullptr != face; i++, face = face->m_next_face)
  {
    if (false == IsValidSubDFace(face, expected_level, nullptr, level->m_ordinary_face_edge_count, bSilentError))
      return false;

    if (0 == i)
    {
      f_id_range[0] = f_id_range[1] = face->m_id;
    }
    else if (face->m_id < f_id_range[0])
      f_id_range[0] = face->m_id;
    else if (face->m_id > f_id_range[1])
      f_id_range[1] = face->m_id;

    last_face = face;
  }
  if (i != level->m_face_count || nullptr != face)
    return ON_SubDIsNotValid(bSilentError);
  if (1 + f_id_range[1] - f_id_range[0] < level->m_face_count)
    return ON_SubDIsNotValid(bSilentError);  
  if (level->m_face[1] != last_face)
    return ON_SubDIsNotValid(bSilentError);
  if ( f_id_range[1] > MaximumFaceId() )
    return ON_SubDIsNotValid(bSilentError);


  // vertex topology validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    for (i = 0; i < vertex->m_edge_count; i++)
    {
      edge = vertex->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, vertex->EdgeDirection(i), bSilentError))
        return false;
    }

    for (i = 0; i < vertex->m_face_count; i++)
    {
      face = vertex->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // edge topology validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    for (i = 0; i < 2; i++)
    {
      vertex = edge->m_vertex[i];
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexEdgeLink(vertex, edge, i, bSilentError))
        return false;
    }

    for (i = 0; i < edge->m_face_count; i++)
    {
      face = edge->Face(i);
      if (false == IsValidSubDFace(face, expected_level, f_id_range, level->m_ordinary_face_edge_count, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, i, ON_UNSET_UINT_INDEX, bSilentError))
        return false;
    }
  }

  // face topology validation
  for (face = level->m_face[0]; nullptr != face; face = face->m_next_face)
  {
    for (i = 0; i < face->m_edge_count; i++)
    {
      edge = face->Edge(i);
      if (false == IsValidSubDEdge(edge, expected_level, e_id_range, bSilentError))
        return false;
      if (false == IsValidEdgeFaceLink(edge, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }

    for (i = 0; i < face->m_edge_count; i++)
    {
      vertex = face->Vertex(i);
      if (false == IsValidSubDVertex(vertex, expected_level, v_id_range, level->m_ordinary_vertex_valence, bSilentError))
        return false;
      if (false == IsValidVertexFaceLink(vertex, face, ON_UNSET_UINT_INDEX, i, bSilentError))
        return false;
    }
  }


  // edge tag validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    if (false == IsValidSubDEdgeTag(edge, bSilentError))
      return false;
  }

  // vertex tag validation
  for (vertex = level->m_vertex[0]; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    if (false == IsValidSubDVertexTag(vertex, bSilentError))
      return false;
  }

  // edge length validation
  for (edge = level->m_edge[0]; nullptr != edge; edge = edge->m_next_edge)
  {
    const ON_3dPoint P[2] = { edge->m_vertex[0]->ControlNetPoint(), edge->m_vertex[1]->ControlNetPoint() };
    if (false == (P[0] != P[1]))
    {
      edge->m_status.SetDamagedState(true);
      return ON_SubDIsNotValid(bSilentError);
    }
  }


  return true;
}